

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTypedefs.cxx
# Opt level: O2

string * __thiscall
kws::Parser::FindTypedef_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,size_t start,size_t end,size_t *pos,
          size_t *beg,size_t *typdefpos)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  string *psVar7;
  ulong uVar8;
  string sub;
  string store;
  string local_70 [32];
  allocator local_50 [32];
  
  psVar7 = &this->m_BufferNoComment;
  sVar2 = std::__cxx11::string::find((char *)psVar7,0x1623fb);
  if (sVar2 == 0xffffffffffffffff) {
    *pos = 0xffffffffffffffff;
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_70);
    return __return_storage_ptr__;
  }
  *typdefpos = sVar2;
  uVar3 = std::__cxx11::string::find((char *)psVar7,0x161d46);
  std::__cxx11::string::substr((ulong)local_70,(ulong)psVar7);
  lVar4 = std::__cxx11::string::find((char *)local_70,0x161d52);
  if ((((lVar4 == -1) &&
       (lVar4 = std::__cxx11::string::find((char *)local_70,0x1549a1), lVar4 == -1)) &&
      (lVar4 = std::__cxx11::string::find((char *)local_70,0x154cbe), lVar4 == -1)) &&
     (lVar4 = std::__cxx11::string::find((char *)local_70,0x1596f8), lVar4 == -1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_50);
    if (uVar3 < end) {
      bVar1 = true;
      uVar8 = uVar3;
      do {
        uVar5 = uVar8;
        bVar6 = true;
        do {
          if (!bVar6) goto LAB_0013ed9e;
          uVar8 = uVar5 - 1;
          lVar4 = uVar5 - 1;
          uVar5 = uVar8;
          bVar6 = bVar1;
        } while ((psVar7->_M_dataplus)._M_p[lVar4] == ' ');
        std::__cxx11::string::string((string *)local_50,(string *)__return_storage_ptr__);
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,(psVar7->_M_dataplus)._M_p[uVar8]);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        *beg = uVar8;
        std::__cxx11::string::~string((string *)local_50);
        bVar1 = false;
      } while( true );
    }
LAB_0013ed9e:
    *pos = uVar3;
  }
  else {
    *pos = uVar3;
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_50);
  }
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindTypedef(size_t start, size_t end,size_t & pos,size_t & beg,size_t & typdefpos)
{
  size_t posTypedef  = m_BufferNoComment.find("typedef",start);
  if(posTypedef == std::string::npos)
    {
    pos = std::string::npos;
    return "";
    }

  typdefpos = posTypedef;
  size_t posSemicolon = m_BufferNoComment.find(";",posTypedef);

  // Check if we have any () in the subword then we don't check the typdef
  std::string sub = m_BufferNoComment.substr(posTypedef,posSemicolon-posTypedef);
  if((sub.find("(",0) != std::string::npos)
    || (sub.find(")",0) != std::string::npos)
    || (sub.find("{",0) != std::string::npos)
    || (sub.find("}",0) != std::string::npos)
    )
    {
    pos = posSemicolon;
    return "";
    }

  std::string typedefname = "";
  if(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    size_t i=posSemicolon-1;
    bool inWord = true;
    bool first = false;
    while(inWord)
      {
      if(m_BufferNoComment[i] != ' ')
        {
        std::string store = typedefname;
        typedefname = m_BufferNoComment[i];
        typedefname += store;
        beg = i;
        inWord = true;
        first = true;
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    }

  pos = posSemicolon;
  return typedefname;
}